

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# execmd.c
# Opt level: O0

int exegen(voccxdef *ctx,objnum obj,prpnum genprop,prpnum verprop,prpnum actprop)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  undefined2 in_DX;
  short in_SI;
  objnum *in_RDI;
  mcmcxdef *unaff_retaddr;
  objnum actobj;
  int hasact;
  objnum verobj;
  int hasver;
  objnum genobj;
  int hasgen;
  objnum in_stack_ffffffffffffffce;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_fffffffffffffffc;
  
  iVar3 = CONCAT22(in_SI,in_DX);
  if (in_SI == -1) {
    return 0;
  }
  uVar1 = objgetap(unaff_retaddr,(objnum)((uint)in_stack_fffffffffffffffc >> 0x10),
                   (prpnum)in_stack_fffffffffffffffc,in_RDI,iVar3);
  if (uVar1 != 0) {
    uVar1 = objgetap(unaff_retaddr,(objnum)((uint)in_stack_fffffffffffffffc >> 0x10),
                     (prpnum)in_stack_fffffffffffffffc,in_RDI,iVar3);
    uVar2 = objgetap(unaff_retaddr,(objnum)((uint)in_stack_fffffffffffffffc >> 0x10),
                     (prpnum)in_stack_fffffffffffffffc,in_RDI,iVar3);
    if (((uVar1 == 0) ||
        (iVar3 = bifinh((voccxdef *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                        (vocidef *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffce), iVar3 != 0)) &&
       ((uVar2 == 0 ||
        (iVar3 = bifinh((voccxdef *)CONCAT44(uVar1,in_stack_ffffffffffffffd8),
                        (vocidef *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                        in_stack_ffffffffffffffce), iVar3 != 0)))) {
      iVar3 = 1;
    }
    else {
      iVar3 = 0;
    }
    return iVar3;
  }
  return 0;
}

Assistant:

static int exegen(voccxdef *ctx, objnum obj, prpnum genprop,
                  prpnum verprop, prpnum actprop)
{
    int     hasgen;                                 /* has xobjGen property */
    objnum  genobj;                         /* object with xobjGen property */
    int     hasver;                               /* has verXoVerb property */
    objnum  verobj;                       /* object with verXoVerb property */
    int     hasact;                                  /* has xoVerb property */
    objnum  actobj;                          /* object with xoVerb property */
    
    /* ignore it if there's no object here */
    if (obj == MCMONINV) return(FALSE);

    /* look up the xobjGen property, and ignore if not present */
    hasgen = objgetap(ctx->voccxmem, obj, genprop, &genobj, FALSE);
    if (!hasgen) return(FALSE);

    /* look up the verXoVerb and xoVerb properties */
    hasver = objgetap(ctx->voccxmem, obj, verprop, &verobj, FALSE);
    hasact = objgetap(ctx->voccxmem, obj, actprop, &actobj, FALSE);

    /* ignore if verXoVerb or xoVerb "overrides" xobjGen */
    if ((hasver && !bifinh(ctx, vocinh(ctx, genobj), verobj))
        || (hasact && !bifinh(ctx, vocinh(ctx, genobj), actobj)))
        return FALSE;
    
    /* all conditions are met - execute dobjGen */
    return TRUE;
}